

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

void __thiscall brynet::net::AcceptError::AcceptError(AcceptError *this,int errorCode)

{
  string sStack_38;
  
  std::__cxx11::to_string(&sStack_38,errorCode);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  *(undefined ***)this = &PTR__runtime_error_001554a0;
  this->mErrorCode = errorCode;
  return;
}

Assistant:

AcceptError(int errorCode) 
                : 
                std::runtime_error(std::to_string(errorCode)), 
                mErrorCode(errorCode)
            {}